

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RngStream.cpp
# Opt level: O1

double anon_unknown.dwarf_8770::MultModM(double a,double s,double c,double m)

{
  double dVar1;
  
  dVar1 = a * s + c;
  if (9007199254740992.0 <= ABS(dVar1)) {
    dVar1 = (double)(long)(a * 7.62939453125e-06) * s;
    dVar1 = (dVar1 - (double)(long)(dVar1 / m) * m) * 131072.0 +
            (a - (double)(long)(a * 7.62939453125e-06) * 131072.0) * s + c;
  }
  dVar1 = dVar1 - (double)(long)(dVar1 / m) * m;
  return (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar1 | (ulong)(m + dVar1) & -(ulong)(dVar1 < 0.0)
                 );
}

Assistant:

double MultModM (double a, double s, double c, double m)
{
    double v;
    long a1;

    v = a * s + c;

    if (v >= two53 || v <= -two53) {
        a1 = static_cast<long> (a / two17);    a -= a1 * two17;
        v  = a1 * s;
        a1 = static_cast<long> (v / m);     v -= a1 * m;
        v = v * two17 + a * s + c;
    }

    a1 = static_cast<long> (v / m);
    /* in case v < 0)*/
    if ((v -= a1 * m) < 0.0) return v += m;   else return v;
}